

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_states.hpp
# Opt level: O2

event_process_result
std::
_Function_handler<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>_&,_afsm::test::events::ready_for_query_&&),_afsm::actions::detail::process_event_handler<2UL>_>
::_M_invoke(_Any_data *__functor,
           tuple<afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
           *__args,ready_for_query *__args_1)

{
  event_process_result eVar1;
  
  eVar1 = afsm::transitions::
          state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::test::connection_fsm_def::transaction::extended_query,_unsigned_long>
          ::process_event<afsm::test::events::ready_for_query>
                    ((state_transition_table<afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::test::connection_fsm_def::transaction::extended_query,_unsigned_long>
                      *)((long)&(__args->
                                super__Tuple_impl<0UL,_afsm::state<afsm::test::connection_fsm_def::transaction::starting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                                ).
                                super__Tuple_impl<1UL,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::simple_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                                .
                                super__Tuple_impl<2UL,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::idle,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::tran_error,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_afsm::state<afsm::test::connection_fsm_def::transaction::exiting,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                                .
                                super__Head_base<2UL,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>,_false>
                                ._M_head_impl.
                                super_state_machine_base<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::none,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>_>
                                .super_type + 8),__args_1);
  return eVar1;
}

Assistant:

actions::event_process_result
    process_event_impl(FSM& enclosing_fsm, Event&& event,
        detail::process_type<actions::event_process_result::process> const&)
    {
        using event_type = typename ::std::decay<Event>::type;
        using can_handle_in_state = ::std::integral_constant<bool,
                actions::is_in_state_action<state_type, event_type>::value>;
        // Transitions and internal event dispatch
        auto res = transitions_.process_event(::std::forward<Event>(event));
        if (res == actions::event_process_result::refuse) {
        // Internal transitions
            res = process_event_impl(enclosing_fsm,
                ::std::forward<Event>(event), can_handle_in_state{});
        }
        return res;
    }